

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O0

Interval<float> pbrt::Interval<float>::FromValueAndError(float v,float err)

{
  Interval<float> IVar1;
  float in_XMM0_Da;
  float in_XMM1_Da;
  Interval<float> i;
  undefined4 local_8;
  undefined4 uStack_4;
  
  if ((in_XMM1_Da != 0.0) || (local_8 = in_XMM0_Da, uStack_4 = in_XMM0_Da, NAN(in_XMM1_Da))) {
    local_8 = NextFloatDown(in_XMM1_Da);
    uStack_4 = NextFloatUp(in_XMM1_Da);
  }
  IVar1.high = uStack_4;
  IVar1.low = local_8;
  return IVar1;
}

Assistant:

PBRT_CPU_GPU
    static Interval FromValueAndError(Float v, Float err) {
        Interval i;
        if (err == 0)
            i.low = i.high = v;
        else {
            // Compute conservative bounds by rounding the endpoints away
            // from the middle. Note that this will be over-conservative in
            // cases where v-err or v+err are exactly representable in
            // floating-point, but it's probably not worth the trouble of
            // checking this case.
            i.low = NextFloatDown(v - err);
            i.high = NextFloatUp(v + err);
        }
        return i;
    }